

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INetwork.cpp
# Opt level: O2

void __thiscall
INetwork::AddNeuron(INetwork *this,INeuron *neuronPtr,size_t neuronId,NEURON_TYPE neuronType)

{
  iterator iVar1;
  mapped_type *ppIVar2;
  long lStack_40;
  size_t neuronId_local;
  INeuron *neuronPtr_local;
  
  neuronId_local = neuronId;
  neuronPtr_local = neuronPtr;
  iVar1 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_INeuron_*>,_std::_Select1st<std::pair<const_unsigned_long,_INeuron_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_INeuron_*>_>_>
          ::find(&(this->neuronMap)._M_t,&neuronId_local);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->neuronMap)._M_t._M_impl.super__Rb_tree_header) {
    ppIVar2 = std::
              map<unsigned_long,_INeuron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_INeuron_*>_>_>
              ::operator[](&this->neuronMap,&neuronId_local);
    *ppIVar2 = neuronPtr;
    if (neuronType == INPUT) {
      lStack_40 = 8;
    }
    else {
      if (neuronType != OUTPUT) {
        return;
      }
      lStack_40 = 0x20;
    }
    std::vector<INeuron_*,_std::allocator<INeuron_*>_>::push_back
              ((vector<INeuron_*,_std::allocator<INeuron_*>_> *)
               ((long)&this->_vptr_INetwork + lStack_40),&neuronPtr_local);
  }
  return;
}

Assistant:

void INetwork::AddNeuron( INeuron *neuronPtr, size_t neuronId, SPIKING_NN::NEURON_TYPE neuronType )
{
    if ( neuronMap.find( neuronId ) == neuronMap.end()) {
        neuronMap[neuronId] = neuronPtr;
        if ( neuronType == SPIKING_NN::NEURON_TYPE::INPUT ) {
            input.push_back( neuronPtr );
        } else if ( neuronType == SPIKING_NN::NEURON_TYPE::OUTPUT ) {
            output.push_back( neuronPtr );
        }
    }
}